

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.hpp
# Opt level: O1

void __thiscall duckdb::ManagedSelection::Initialize(ManagedSelection *this,idx_t new_size)

{
  sel_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this->size = new_size;
  SelectionVector::Initialize(&this->sel_vec,new_size);
  (this->internal_opt_selvec).sel = &this->sel_vec;
  psVar1 = (this->sel_vec).sel_vector;
  this_00 = (this->internal_opt_selvec).vec.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->internal_opt_selvec).vec.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->internal_opt_selvec).vec.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->internal_opt_selvec).vec.sel_vector = psVar1;
  (this->internal_opt_selvec).sel = &(this->internal_opt_selvec).vec;
  this->initialized = true;
  return;
}

Assistant:

void Initialize(idx_t new_size) {
		D_ASSERT(!initialized);
		this->size = new_size;
		sel_vec.Initialize(new_size);
		internal_opt_selvec.Initialize(&sel_vec);
		initialized = true;
	}